

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O3

bool duckdb::FileSystem::IsRemoteFile(string *path,string *extension)

{
  pointer pcVar1;
  char *pcVar2;
  undefined1 *puVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  undefined1 *__s;
  bool bVar7;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  __s = EXTENSION_FILE_PREFIXES;
  lVar6 = 0x480;
  while( true ) {
    pcVar1 = (path->_M_dataplus)._M_p;
    local_50 = local_40;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + path->_M_string_length);
    local_70 = local_60;
    sVar5 = strlen(__s);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s,__s + sVar5);
    puVar3 = local_70;
    if (local_48 < local_68) {
      bVar7 = false;
    }
    else if (local_68 == 0) {
      bVar7 = true;
    }
    else {
      iVar4 = bcmp(local_70,local_50,local_68);
      bVar7 = iVar4 == 0;
    }
    if (puVar3 != local_60) {
      operator_delete(puVar3);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (bVar7 != false) break;
    __s = __s + 0x60;
    lVar6 = lVar6 + -0x60;
    if (lVar6 == 0) {
      return false;
    }
  }
  pcVar2 = (char *)extension->_M_string_length;
  strlen(__s + 0x30);
  ::std::__cxx11::string::_M_replace((ulong)extension,0,pcVar2,(ulong)(__s + 0x30));
  return bVar7;
}

Assistant:

bool FileSystem::IsRemoteFile(const string &path, string &extension) {
	for (const auto &entry : EXTENSION_FILE_PREFIXES) {
		if (StringUtil::StartsWith(path, entry.name)) {
			extension = entry.extension;
			return true;
		}
	}
	return false;
}